

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po_test.cc
# Opt level: O2

void __thiscall
bool_implicit_and_explicit_options::test_method(bool_implicit_and_explicit_options *this)

{
  __uniq_ptr_data<char_*,_std::default_delete<char_*>,_true,_true> argv_00;
  options_boost_po *this_00;
  bool bool_switch_unspecified;
  bool bool_switch;
  allocator local_270 [8];
  undefined8 local_268;
  shared_count sStack_260;
  int argc;
  options_boost_po *local_250;
  unique_ptr<char_*,_std::default_delete<char_*>_> argv;
  string local_240;
  string local_220;
  string local_200;
  option_group_definition arg_group;
  undefined1 local_1a8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [8];
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_78;
  char *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  char command_line [18];
  
  builtin_strncpy(command_line,"exe --bool_switch",0x12);
  argv_00.super___uniq_ptr_impl<char_*,_std::default_delete<char_*>_>._M_t.
  super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*>_>.
  super__Head_base<0UL,_char_**,_false>._M_head_impl =
       (__uniq_ptr_impl<char_*,_std::default_delete<char_*>_>)
       convert_to_command_args(command_line,&argc,0x40);
  argv._M_t.super___uniq_ptr_impl<char_*,_std::default_delete<char_*>_>._M_t.
  super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*>_>.
  super__Head_base<0UL,_char_**,_false>._M_head_impl =
       (__uniq_ptr_data<char_*,_std::default_delete<char_*>,_true,_true>)
       (__uniq_ptr_data<char_*,_std::default_delete<char_*>,_true,_true>)
       argv_00.super___uniq_ptr_impl<char_*,_std::default_delete<char_*>_>._M_t.
       super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*>_>.
       super__Head_base<0UL,_char_**,_false>._M_head_impl;
  this_00 = (options_boost_po *)operator_new(0x2e8);
  VW::config::options_boost_po::options_boost_po
            (this_00,argc,
             (char **)argv_00.super___uniq_ptr_impl<char_*,_std::default_delete<char_*>_>._M_t.
                      super__Tuple_impl<0UL,_char_**,_std::default_delete<char_*>_>.
                      super__Head_base<0UL,_char_**,_false>._M_head_impl);
  local_250 = this_00;
  std::__cxx11::string::string((string *)&local_200,"group",(allocator *)local_1a8);
  VW::config::option_group_definition::option_group_definition(&arg_group,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::string((string *)&local_220,"bool_switch",local_270);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_1a8,&local_220,&bool_switch);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>>
            (&arg_group,(typed_option<bool> *)local_1a8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_1a8);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::string((string *)&local_240,"bool_switch_unspecified",local_270);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_1a8,&local_240,&bool_switch_unspecified);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>>
            (&arg_group,(typed_option<bool> *)local_1a8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_1a8);
  std::__cxx11::string::~string((string *)&local_240);
  (**(this_00->super_options_i)._vptr_options_i)(this_00,&arg_group);
  local_58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_50 = "";
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_58,0x6d);
  local_270[0] = (allocator)0x1;
  local_268 = 0;
  sStack_260.pi_ = (sp_counted_base *)0x0;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_002e5ea8;
  local_1a8._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_190[0]._M_allocated_capacity = "no exceptions thrown by options->add_and_parse(arg_group)";
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_70 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_260);
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b8,0x6f);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_002e5760;
  local_1a8._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_190[0]._M_allocated_capacity = (long)"%f\t" + 3;
  local_d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_d0 = "";
  local_270[0] = (allocator)0x1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_1a8,&local_d8,0x6f,1,2,&bool_switch,"bool_switch",local_270,"true");
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8,0x70);
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_002e5760;
  local_1a8._16_8_ = &boost::unit_test::lazy_ostream::inst;
  local_190[0]._M_allocated_capacity = (long)"%f\t" + 3;
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/options_boost_po_test.cc"
  ;
  local_100 = "";
  local_270[0] = (allocator)0x0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_1a8,&local_108,0x70,1,2,&bool_switch_unspecified,"bool_switch_unspecified",
             local_270,"false");
  VW::config::option_group_definition::~option_group_definition(&arg_group);
  (*(local_250->super_options_i)._vptr_options_i[9])();
  std::unique_ptr<char_*,_std::default_delete<char_*>_>::~unique_ptr(&argv);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(bool_implicit_and_explicit_options) {
  bool bool_switch;
  bool bool_switch_unspecified;

  char command_line[] = "exe --bool_switch";
  int argc;
  // Only the returned char* needs to be deleted as the individual pointers simply point into command_line.
  std::unique_ptr<char*> argv(convert_to_command_args(command_line, argc));

  std::unique_ptr<options_i> options = std::unique_ptr<options_boost_po>(
    new options_boost_po(argc, argv.get()));

  option_group_definition arg_group("group");
  arg_group.add(make_option("bool_switch", bool_switch));
  arg_group.add(make_option("bool_switch_unspecified", bool_switch_unspecified));

  BOOST_CHECK_NO_THROW(options->add_and_parse(arg_group));

  BOOST_CHECK_EQUAL(bool_switch, true);
  BOOST_CHECK_EQUAL(bool_switch_unspecified, false);
}